

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cKHRDebugTests.cpp
# Opt level: O0

GLuint gl4cts::KHRDebug::LabelsTest::createFramebuffer(Functions *gl,RenderContext *rc)

{
  bool bVar1;
  deUint32 dVar2;
  undefined4 local_28;
  deUint32 local_24;
  GLint currentFbo;
  GLuint local_1c;
  RenderContext *pRStack_18;
  GLuint id;
  RenderContext *rc_local;
  Functions *gl_local;
  
  local_1c = 0;
  pRStack_18 = rc;
  rc_local = (RenderContext *)gl;
  currentFbo = (*rc->_vptr_RenderContext[2])();
  local_24 = (deUint32)glu::ApiType::core(4,5);
  bVar1 = glu::contextSupports((ContextType)currentFbo,(ApiType)local_24);
  if (bVar1) {
    (*(code *)rc_local[0x78]._vptr_RenderContext)(1,&local_1c);
    dVar2 = (*(code *)rc_local[0x100]._vptr_RenderContext)();
    glu::checkError(dVar2,"CreateFramebuffers",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                    ,0x38d);
  }
  else {
    (*(code *)rc_local[0x10d]._vptr_RenderContext)(0x8ca6,&local_28);
    (*(code *)rc_local[0xda]._vptr_RenderContext)(1,&local_1c);
    (*(code *)rc_local[0xf]._vptr_RenderContext)(0x8ca9,local_1c);
    (*(code *)rc_local[0xf]._vptr_RenderContext)(0x8ca9,local_28);
    dVar2 = (*(code *)rc_local[0x100]._vptr_RenderContext)();
    glu::checkError(dVar2,"GenFramebuffers / BindFramebuffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                    ,0x396);
  }
  return local_1c;
}

Assistant:

GLuint LabelsTest::createFramebuffer(const Functions* gl, const glu::RenderContext* rc)
{
	GLuint id = 0;
	if (glu::contextSupports(rc->getType(), glu::ApiType::core(4, 5)))
	{
		gl->createFramebuffers(1, &id);
		GLU_EXPECT_NO_ERROR(gl->getError(), "CreateFramebuffers");
	}
	else
	{
		GLint currentFbo;
		gl->getIntegerv(GL_DRAW_FRAMEBUFFER_BINDING, &currentFbo);
		gl->genFramebuffers(1, &id);
		gl->bindFramebuffer(GL_DRAW_FRAMEBUFFER, id);
		gl->bindFramebuffer(GL_DRAW_FRAMEBUFFER, currentFbo);
		GLU_EXPECT_NO_ERROR(gl->getError(), "GenFramebuffers / BindFramebuffer");
	}

	return id;
}